

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O2

axbStatus_t axbFinalize(axbHandle_s *handle)

{
  axbStatus_t aVar1;
  size_t i;
  ulong uVar2;
  
  aVar1 = 0x67932;
  if (handle->init == 0x67932) {
    handle->init = 0x67933;
    for (uVar2 = 0; uVar2 < handle->opBackends_size; uVar2 = uVar2 + 1) {
      axbOpBackendDestroy(handle->opBackends[uVar2]);
    }
    free(handle->opBackends);
    for (uVar2 = 0; uVar2 < handle->memBackends_size; uVar2 = uVar2 + 1) {
      axbMemBackendDestroy(handle->memBackends[uVar2]);
    }
    free(handle->memBackends);
    free(handle);
    aVar1 = 0;
  }
  return aVar1;
}

Assistant:

axbStatus_t axbFinalize(struct axbHandle_s *handle)
{
  // guard against multiple free()
  if (handle->init != 424242) return 424242;
  handle->init += 1; // helper to track multiple free's on handle

  // free op backends
  // Note: op-backends may depend on mem-backends, so it's important to free the op-backends first.
  for (size_t i=0; i<handle->opBackends_size; ++i) {
    axbOpBackendDestroy(handle->opBackends[i]);
  }
  free(handle->opBackends);

  // free mem backends
  for (size_t i=0; i<handle->memBackends_size; ++i) {
    axbMemBackendDestroy(handle->memBackends[i]);
  }
  free(handle->memBackends);

  free(handle);
  return 0;
}